

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_hash.c
# Opt level: O0

void gravity_hash_iterate3
               (gravity_hash_t *hashtable,gravity_hash_iterate3_fn iterate,void *data1,void *data2,
               void *data3)

{
  hash_node_t *local_40;
  hash_node_t *node;
  uint32_t i;
  void *data3_local;
  void *data2_local;
  void *data1_local;
  gravity_hash_iterate3_fn iterate_local;
  gravity_hash_t *hashtable_local;
  
  if ((hashtable != (gravity_hash_t *)0x0) && (iterate != (gravity_hash_iterate3_fn)0x0)) {
    for (node._4_4_ = 0; node._4_4_ < hashtable->size; node._4_4_ = node._4_4_ + 1) {
      local_40 = hashtable->nodes[node._4_4_];
      if (local_40 != (hash_node_t *)0x0) {
        for (; local_40 != (hash_node_t *)0x0; local_40 = local_40->next) {
          (*iterate)(hashtable,local_40->key,local_40->value,data1,data2,data3);
        }
      }
    }
  }
  return;
}

Assistant:

void gravity_hash_iterate3 (gravity_hash_t *hashtable, gravity_hash_iterate3_fn iterate, void *data1, void *data2, void *data3) {
    if ((!hashtable) || (!iterate)) return;
    
    for (uint32_t i=0; i<hashtable->size; ++i) {
        hash_node_t *node = hashtable->nodes[i];
        if (!node) continue;
        
        while (node) {
            iterate(hashtable, node->key, node->value, data1, data2, data3);
            node = node->next;
        }
    }
}